

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DCData_Sequence_Parser.cpp
# Opt level: O1

h__SequenceParser * __thiscall
ASDCP::DCData::SequenceParser::h__SequenceParser::OpenRead(h__SequenceParser *this)

{
  long lVar1;
  long in_RSI;
  BytestreamParser Parser;
  FrameBuffer TmpBuffer;
  allocator<char> local_d9;
  undefined1 local_d8 [32];
  long local_b8 [2];
  FrameBuffer local_a8;
  BytestreamParser local_80;
  _func_int *local_70 [11];
  
  if (*(long *)(in_RSI + 0x10) == in_RSI + 0x10) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_ENDOFFILE);
  }
  else {
    *(long *)(in_RSI + 0x48) = *(long *)(in_RSI + 0x10);
    BytestreamParser::BytestreamParser((BytestreamParser *)local_d8);
    ASDCP::FrameBuffer::FrameBuffer(&local_a8);
    local_a8._vptr_FrameBuffer = (_func_int **)&PTR__FrameBuffer_002286a8;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,*(char **)(*(long *)(in_RSI + 0x48) + 0x10),
               (allocator<char> *)(local_d8 + 0x10));
    lVar1 = Kumu::FileSize((string *)&local_80);
    if (local_80._vptr_BytestreamParser != local_70) {
      operator_delete(local_80._vptr_BytestreamParser,(ulong)(local_70[0] + 1));
    }
    if (lVar1 == 0) {
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_NOT_FOUND);
    }
    else {
      if (0xffffffff < lVar1) {
        __assert_fail("file_size <= 0xFFFFFFFFL",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/DCData_Sequence_Parser.cpp"
                      ,0x9f,
                      "ASDCP::Result_t ASDCP::DCData::SequenceParser::h__SequenceParser::OpenRead()"
                     );
      }
      ASDCP::FrameBuffer::Capacity((FrameBuffer *)this,(ui32_t)&local_a8);
      if (-1 < (int)this->m_FramesRead) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_d8 + 0x10),*(char **)(*(long *)(in_RSI + 0x48) + 0x10),&local_d9
                  );
        BytestreamParser::OpenReadFrame
                  (&local_80,(string *)local_d8,(FrameBuffer *)(local_d8 + 0x10));
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
        Kumu::Result_t::~Result_t((Result_t *)&local_80);
        if ((long *)local_d8._16_8_ != local_b8) {
          operator_delete((void *)local_d8._16_8_,local_b8[0] + 1);
        }
      }
      if (-1 < (int)this->m_FramesRead) {
        BytestreamParser::FillDCDataDescriptor(&local_80,(DCDataDescriptor *)local_d8);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
        Kumu::Result_t::~Result_t((Result_t *)&local_80);
      }
      if (-1 < (int)this->m_FramesRead) {
        *(undefined4 *)(in_RSI + 0x68) = *(undefined4 *)(in_RSI + 0x20);
      }
    }
    ASDCP::FrameBuffer::~FrameBuffer(&local_a8);
    BytestreamParser::~BytestreamParser((BytestreamParser *)local_d8);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::DCData::SequenceParser::h__SequenceParser::OpenRead()
{
  if ( m_FileList.empty() )
    return RESULT_ENDOFFILE;

  m_CurrentFile = m_FileList.begin();
  BytestreamParser Parser;
  FrameBuffer TmpBuffer;

  Kumu::fsize_t file_size = Kumu::FileSize((*m_CurrentFile).c_str());

  if ( file_size == 0 )
    return RESULT_NOT_FOUND;

  assert(file_size <= 0xFFFFFFFFL);
  Result_t result = TmpBuffer.Capacity((ui32_t) file_size);

  if ( ASDCP_SUCCESS(result) )
    result = Parser.OpenReadFrame((*m_CurrentFile).c_str(), TmpBuffer);

  if ( ASDCP_SUCCESS(result) )
    result = Parser.FillDCDataDescriptor(m_DDesc);

  // how big is it?
  if ( ASDCP_SUCCESS(result) )
    m_DDesc.ContainerDuration = m_FileList.size();

  return result;
}